

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::FunctionCallVar::add_sink(FunctionCallVar *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  undefined4 extraout_var;
  Generator *pGVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  for (p_Var3 = (this->args_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->args_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    (**(code **)(**(long **)(p_Var3 + 2) + 0xa8))(*(long **)(p_Var3 + 2),stmt);
  }
  iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
  pGVar4 = Const::const_gen();
  if ((Generator *)CONCAT44(extraout_var,iVar2) == pGVar4) {
    iVar2 = (*(((stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               left_->super_IRNode)._vptr_IRNode[0xd])();
    (this->super_Var).generator_ = (Generator *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,(string *)&this->func_def_->function_name_);
    bVar1 = Generator::has_function
                      ((Generator *)CONCAT44(extraout_var_01,iVar2),
                       (string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    if (!bVar1) {
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
      Stmt::as<kratos::FunctionStmtBlock>((Stmt *)&stack0xffffffffffffffb8);
      Generator::add_function
                ((Generator *)CONCAT44(extraout_var_02,iVar2),
                 (shared_ptr<kratos::FunctionStmtBlock> *)&stack0xffffffffffffffb8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
      Var::as<kratos::FunctionCallVar>((Var *)&stack0xffffffffffffffb8);
      Generator::add_call_var
                ((Generator *)CONCAT44(extraout_var_03,iVar2),
                 (shared_ptr<kratos::FunctionCallVar> *)&stack0xffffffffffffffb8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void FunctionCallVar::add_sink(const std::shared_ptr<AssignStmt> &stmt) {
    for (auto const &iter : args_) {
        iter.second->add_sink(stmt);
    }
    // FIXME: this is a very hacky fix on constant generators
    if (generator() == Const::const_gen()) {
        // use left hand size of stmt
        generator_ = stmt->left()->generator();
        // change the function def to the new generator
        if (!generator()->has_function(func_def_->function_name())) {
            generator()->add_function(func_def_->as<FunctionStmtBlock>());
            generator()->add_call_var(as<FunctionCallVar>());
        }
    }
}